

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall Xxx::doSomething(Xxx *this)

{
  long lVar1;
  ostream *poVar2;
  long in_FS_OFFSET;
  Xxx *this_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->size != 0) {
    memset(this->buffer,0x78,this->size);
    poVar2 = std::operator<<((ostream *)&std::cout,"doSomething buffer(");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->size);
    std::operator<<(poVar2,")\n");
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void doSomething(void)
    {
        if (0 < size)
        {
            memset(buffer, 'x', size);
            std::cout << "doSomething buffer(" << size << ")\n";
        }
    }